

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_suite.cpp
# Opt level: O0

void parser_suite::parse_empty(void)

{
  bool bVar1;
  array<unsigned_char,_0UL> *in_RDX;
  undefined1 local_48 [8];
  basic_variable<std::allocator<char>_> result;
  bintoken local_9 [8];
  array<unsigned_char,_0UL> input;
  
  local_9[0] = (bintoken)0x0;
  trial::protocol::bintoken::parse<std::array<unsigned_char,0ul>,std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)local_48,local_9,in_RDX);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::same<trial::dynamic::nullable>
                    ((basic_variable<std::allocator<char>_> *)local_48);
  boost::detail::test_impl
            ("result.same<nullable>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x1d,"void parser_suite::parse_empty()",bVar1);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::empty
                    ((basic_variable<std::allocator<char>_> *)local_48);
  boost::detail::test_impl
            ("result.empty()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x1e,"void parser_suite::parse_empty()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_48);
  return;
}

Assistant:

void parse_empty()
{
    const std::array<value_type, 0> input = {};
    auto result = bintoken::parse(input);
    TRIAL_PROTOCOL_TEST(result.same<nullable>());
    TRIAL_PROTOCOL_TEST(result.empty());
}